

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

void PrintExtraInfoLossy(WebPPicture *pic,int short_output,int full_details,char *file_name)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char *pcVar5;
  int totals [4];
  int total;
  int num_skip;
  int num_i16;
  int num_i4;
  WebPAuxStats *stats;
  char *in_stack_ffffffffffffffb8;
  WebPAuxStats *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  uint uVar6;
  
  puVar3 = *(uint **)(in_RDI + 0x80);
  if (in_ESI == 0) {
    uVar1 = puVar3[6];
    uVar2 = puVar3[7];
    uVar6 = puVar3[8];
    iVar4 = uVar1 + uVar2;
    fprintf(stderr,"File:      %s\n",in_RCX);
    pcVar5 = "";
    if (puVar3[0x23] != 0) {
      pcVar5 = " (with alpha)";
    }
    fprintf(stderr,"Dimension: %d x %d%s\n",(ulong)*(uint *)(in_RDI + 8),
            (ulong)*(uint *)(in_RDI + 0xc),pcVar5);
    fprintf(stderr,
            "Output:    %d bytes Y-U-V-All-PSNR %2.2f %2.2f %2.2f   %2.2f dB\n           (%.2f bpp)\n"
            ,(double)(float)puVar3[1],(double)(float)puVar3[2],(double)(float)puVar3[3],
            (double)(float)puVar3[4],
            (double)((((float)(int)*puVar3 * 8.0) / (float)*(int *)(in_RDI + 8)) /
                    (float)*(int *)(in_RDI + 0xc)),(ulong)*puVar3);
    if (0 < iVar4) {
      memset(&stack0xffffffffffffffb8,0,0x10);
      fprintf(stderr,
              "block count:  intra4:     %6d  (%.2f%%)\n              intra16:    %6d  (%.2f%%)\n              skipped:    %6d  (%.2f%%)\n"
              ,(double)(((float)(int)uVar1 * 100.0) / (float)iVar4),
              (double)(((float)(int)uVar2 * 100.0) / (float)iVar4),
              (double)(((float)(int)uVar6 * 100.0) / (float)iVar4),(ulong)uVar1,(ulong)uVar2,
              (ulong)uVar6);
      fprintf(stderr,
              "bytes used:  header:         %6d  (%.1f%%)\n             mode-partition: %6d  (%.1f%%)\n"
              ,(double)(((float)(int)puVar3[9] * 100.0) / (float)(int)*puVar3),
              (double)(((float)(int)puVar3[10] * 100.0) / (float)(int)*puVar3),(ulong)puVar3[9],
              (ulong)puVar3[10]);
      if (0 < (int)puVar3[0x23]) {
        fprintf(stderr,"             transparency:   %6d (%.1f dB)\n",(double)(float)puVar3[5],
                (ulong)puVar3[0x23]);
      }
      fprintf(stderr," Residuals bytes  |segment 1|segment 2|segment 3|segment 4|  total\n");
      if (in_EDX != 0) {
        fprintf(stderr,"  intra4-coeffs:  ");
        PrintByteCount((int *)CONCAT44(uVar6,iVar4),in_stack_ffffffffffffffcc,
                       &in_stack_ffffffffffffffc0->coded_size);
        fprintf(stderr," intra16-coeffs:  ");
        PrintByteCount((int *)CONCAT44(uVar6,iVar4),in_stack_ffffffffffffffcc,
                       &in_stack_ffffffffffffffc0->coded_size);
        fprintf(stderr,"  chroma coeffs:  ");
        PrintByteCount((int *)CONCAT44(uVar6,iVar4),in_stack_ffffffffffffffcc,
                       &in_stack_ffffffffffffffc0->coded_size);
      }
      fprintf(stderr,"    macroblocks:  ");
      PrintPercents(&in_stack_ffffffffffffffc0->coded_size);
      fprintf(stderr,"      quantizer:  ");
      PrintValues(&in_stack_ffffffffffffffc0->coded_size);
      fprintf(stderr,"   filter level:  ");
      PrintValues(&in_stack_ffffffffffffffc0->coded_size);
      if (in_EDX != 0) {
        fprintf(stderr,"------------------+---------");
        fprintf(stderr,"+---------+---------+---------+-----------------\n");
        fprintf(stderr," segments total:  ");
        PrintByteCount((int *)CONCAT44(uVar6,iVar4),in_stack_ffffffffffffffcc,
                       &in_stack_ffffffffffffffc0->coded_size);
      }
    }
    if (0 < (int)puVar3[0x2a]) {
      PrintFullLosslessInfo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  else {
    fprintf(stderr,"%7d %2.2f\n",(double)(float)puVar3[4],(ulong)*puVar3);
  }
  return;
}

Assistant:

static void PrintExtraInfoLossy(const WebPPicture* const pic, int short_output,
                                int full_details,
                                const char* const file_name) {
  const WebPAuxStats* const stats = pic->stats;
  if (short_output) {
    fprintf(stderr, "%7d %2.2f\n", stats->coded_size, stats->PSNR[3]);
  } else {
    const int num_i4 = stats->block_count[0];
    const int num_i16 = stats->block_count[1];
    const int num_skip = stats->block_count[2];
    const int total = num_i4 + num_i16;
    WFPRINTF(stderr, "File:      %s\n", (const W_CHAR*)file_name);
    fprintf(stderr, "Dimension: %d x %d%s\n",
            pic->width, pic->height,
            stats->alpha_data_size ? " (with alpha)" : "");
    fprintf(stderr, "Output:    "
            "%d bytes Y-U-V-All-PSNR %2.2f %2.2f %2.2f   %2.2f dB\n"
            "           (%.2f bpp)\n",
            stats->coded_size,
            stats->PSNR[0], stats->PSNR[1], stats->PSNR[2], stats->PSNR[3],
            8.f * stats->coded_size / pic->width / pic->height);
    if (total > 0) {
      int totals[4] = { 0, 0, 0, 0 };
      fprintf(stderr, "block count:  intra4:     %6d  (%.2f%%)\n"
                      "              intra16:    %6d  (%.2f%%)\n"
                      "              skipped:    %6d  (%.2f%%)\n",
              num_i4, 100.f * num_i4 / total,
              num_i16, 100.f * num_i16 / total,
              num_skip, 100.f * num_skip / total);
      fprintf(stderr, "bytes used:  header:         %6d  (%.1f%%)\n"
                      "             mode-partition: %6d  (%.1f%%)\n",
              stats->header_bytes[0],
              100.f * stats->header_bytes[0] / stats->coded_size,
              stats->header_bytes[1],
              100.f * stats->header_bytes[1] / stats->coded_size);
      if (stats->alpha_data_size > 0) {
        fprintf(stderr, "             transparency:   %6d (%.1f dB)\n",
                stats->alpha_data_size, stats->PSNR[4]);
      }
      fprintf(stderr, " Residuals bytes  "
                      "|segment 1|segment 2|segment 3"
                      "|segment 4|  total\n");
      if (full_details) {
        fprintf(stderr, "  intra4-coeffs:  ");
        PrintByteCount(stats->residual_bytes[0], stats->coded_size, totals);
        fprintf(stderr, " intra16-coeffs:  ");
        PrintByteCount(stats->residual_bytes[1], stats->coded_size, totals);
        fprintf(stderr, "  chroma coeffs:  ");
        PrintByteCount(stats->residual_bytes[2], stats->coded_size, totals);
      }
      fprintf(stderr, "    macroblocks:  ");
      PrintPercents(stats->segment_size);
      fprintf(stderr, "      quantizer:  ");
      PrintValues(stats->segment_quant);
      fprintf(stderr, "   filter level:  ");
      PrintValues(stats->segment_level);
      if (full_details) {
        fprintf(stderr, "------------------+---------");
        fprintf(stderr, "+---------+---------+---------+-----------------\n");
        fprintf(stderr, " segments total:  ");
        PrintByteCount(totals, stats->coded_size, NULL);
      }
    }
    if (stats->lossless_size > 0) {
      PrintFullLosslessInfo(stats, "alpha");
    }
  }
}